

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_Deactivate
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  long *plVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  undefined8 uVar4;
  PClass *pPVar5;
  undefined4 in_register_00000014;
  char *pcVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      plVar1 = (long *)(param->field_0).field_1.a;
      if (plVar1 != (long *)0x0) {
        if (plVar1[1] == 0) {
          auVar8 = (**(code **)*plVar1)(plVar1);
          uVar4 = auVar8._8_8_;
          plVar1[1] = auVar8._0_8_;
        }
        pPVar5 = (PClass *)plVar1[1];
        bVar7 = pPVar5 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar7;
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar7);
        defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar5 == pPVar3 || bVar7);
        if (pPVar5 != pPVar3 && !bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042f03d;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          puVar2 = (undefined8 *)param[1].field_0.field_1.a;
          if (puVar2 != (undefined8 *)0x0) {
            if (puVar2[1] == 0) {
              uVar4 = (**(code **)*puVar2)(puVar2,defaultparam,uVar4,ret);
              puVar2[1] = uVar4;
            }
            pPVar5 = (PClass *)puVar2[1];
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar7) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar7 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar7) {
              pcVar6 = "activator == NULL || activator->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0042f05c;
            }
          }
          (**(code **)(*plVar1 + 0x70))(plVar1,puVar2);
          return 0;
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0042f05c:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1324,
                    "int AF_AActor_Deactivate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042f03d:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1323,
                "int AF_AActor_Deactivate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Deactivate)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(activator, AActor);
	self->Deactivate(activator);
	return 0;
}